

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duel.h
# Opt level: O0

void __thiscall duel::printField(duel *this)

{
  long lVar1;
  int iVar2;
  _Setw _Var3;
  ostream *poVar4;
  size_type sVar5;
  uint *puVar6;
  long lVar7;
  __cxx11 local_270 [36];
  int local_24c;
  hand local_248;
  hand local_228;
  hand local_208;
  hand local_1e8;
  int local_1c4;
  field local_1c0;
  field local_1a0;
  int local_17c;
  __cxx11 local_178 [32];
  __cxx11 local_158 [32];
  int local_138;
  int local_134;
  field local_130;
  int local_10c;
  field local_108;
  int local_e4;
  hand local_e0;
  int local_bc;
  hand local_b8;
  hand local_98;
  int local_74;
  hand local_70;
  int local_50;
  __cxx11 local_40 [32];
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  duel *local_10;
  duel *this_local;
  
  local_10 = this;
  poVar4 = std::operator<<((ostream *)&std::cout,"[");
  local_14 = (int)std::setw(0x32);
  poVar4 = std::operator<<(poVar4,(_Setw)local_14);
  poVar4 = std::operator<<(poVar4,"player 2");
  local_18 = (int)std::setw(0x32);
  poVar4 = std::operator<<(poVar4,(_Setw)local_18);
  poVar4 = std::operator<<(poVar4,"]");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"| deck");
  local_1c = (int)std::setw(0x5f);
  poVar4 = std::operator<<(poVar4,(_Setw)local_1c);
  poVar4 = std::operator<<(poVar4,"|");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"| [");
  sVar5 = std::stack<card,_std::deque<card,_std::allocator<card>_>_>::size(&this->deck);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5 >> 1);
  poVar4 = std::operator<<(poVar4,"]");
  sVar5 = std::stack<card,_std::deque<card,_std::allocator<card>_>_>::size(&this->deck);
  std::__cxx11::to_string(local_40,sVar5 >> 1);
  iVar2 = std::__cxx11::string::size();
  local_20 = (int)std::setw(0x61 - iVar2);
  poVar4 = std::operator<<(poVar4,(_Setw)local_20);
  poVar4 = std::operator<<(poVar4,"|");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_40);
  poVar4 = std::operator<<((ostream *)&std::cout,"| hand");
  local_50 = (int)std::setw(0x5f);
  poVar4 = std::operator<<(poVar4,(_Setw)local_50);
  poVar4 = std::operator<<(poVar4,"|");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  if (this->player == 2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"| ");
    hand::printHand_abi_cxx11_(&local_70);
    poVar4 = std::operator<<(poVar4,(string *)&local_70);
    hand::printHand_abi_cxx11_(&local_98);
    iVar2 = std::__cxx11::string::size();
    local_74 = (int)std::setw(99 - iVar2);
    poVar4 = std::operator<<(poVar4,(_Setw)local_74);
    poVar4 = std::operator<<(poVar4,"|");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"| ");
    hand::printHidden_abi_cxx11_(&local_b8);
    poVar4 = std::operator<<(poVar4,(string *)&local_b8);
    hand::printHidden_abi_cxx11_(&local_e0);
    iVar2 = std::__cxx11::string::size();
    local_bc = (int)std::setw(99 - iVar2);
    poVar4 = std::operator<<(poVar4,(_Setw)local_bc);
    poVar4 = std::operator<<(poVar4,"|");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"| pile");
  local_e4 = (int)std::setw(0x5f);
  poVar4 = std::operator<<(poVar4,(_Setw)local_e4);
  poVar4 = std::operator<<(poVar4,"|");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"| ");
  field::printPile_abi_cxx11_(&local_108);
  poVar4 = std::operator<<(poVar4,(string *)&local_108);
  field::printPile_abi_cxx11_(&local_130);
  iVar2 = std::__cxx11::string::size();
  local_10c = (int)std::setw(99 - iVar2);
  poVar4 = std::operator<<(poVar4,(_Setw)local_10c);
  poVar4 = std::operator<<(poVar4,"|");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_108);
  poVar4 = std::operator<<((ostream *)&std::cout,"| score");
  local_134 = (int)std::setw(0x5e);
  poVar4 = std::operator<<(poVar4,(_Setw)local_134);
  poVar4 = std::operator<<(poVar4,"|");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"| ");
  poVar4 = std::operator<<(poVar4,"{");
  puVar6 = field::getPile(&this->field2);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*puVar6);
  poVar4 = std::operator<<(poVar4,"}");
  puVar6 = field::getPile(&this->field2);
  std::__cxx11::to_string(local_158,*puVar6);
  iVar2 = std::__cxx11::string::size();
  local_138 = (int)std::setw(0x61 - iVar2);
  poVar4 = std::operator<<(poVar4,(_Setw)local_138);
  poVar4 = std::operator<<(poVar4,"|");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_158);
  lVar1 = *(long *)(std::cout + -0x18);
  puVar6 = field::getPile(&this->field1);
  std::__cxx11::to_string(local_178,*puVar6);
  lVar7 = std::__cxx11::string::size();
  std::ios_base::width((ios_base *)((long)&std::cout + lVar1),0x61 - lVar7);
  std::__cxx11::string::~string((string *)local_178);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::left);
  poVar4 = std::operator<<(poVar4,"|");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
  poVar4 = std::operator<<(poVar4,"{");
  puVar6 = field::getPile(&this->field1);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*puVar6);
  poVar4 = std::operator<<(poVar4,"} |");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"|");
  local_17c = (int)std::setw(100);
  poVar4 = std::operator<<(poVar4,(_Setw)local_17c);
  poVar4 = std::operator<<(poVar4,"score |");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  lVar1 = *(long *)(std::cout + -0x18);
  field::printPile_abi_cxx11_(&local_1a0);
  lVar7 = std::__cxx11::string::size();
  std::ios_base::width((ios_base *)((long)&std::cout + lVar1),99 - lVar7);
  std::__cxx11::string::~string((string *)&local_1a0);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::left);
  poVar4 = std::operator<<(poVar4,"|");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
  field::printPile_abi_cxx11_(&local_1c0);
  poVar4 = std::operator<<(poVar4,(string *)&local_1c0);
  poVar4 = std::operator<<(poVar4," |");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_1c0);
  poVar4 = std::operator<<((ostream *)&std::cout,"|");
  local_1c4 = (int)std::setw(100);
  poVar4 = std::operator<<(poVar4,(_Setw)local_1c4);
  poVar4 = std::operator<<(poVar4,"pile |");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  if (this->player == 1) {
    lVar1 = *(long *)(std::cout + -0x18);
    hand::printHand_abi_cxx11_(&local_1e8);
    lVar7 = std::__cxx11::string::size();
    std::ios_base::width((ios_base *)((long)&std::cout + lVar1),99 - lVar7);
    std::__cxx11::string::~string((string *)&local_1e8);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::left);
    poVar4 = std::operator<<(poVar4,"|");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
    hand::printHand_abi_cxx11_(&local_208);
    poVar4 = std::operator<<(poVar4,(string *)&local_208);
    poVar4 = std::operator<<(poVar4," |");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_208);
  }
  else {
    lVar1 = *(long *)(std::cout + -0x18);
    hand::printHidden_abi_cxx11_(&local_228);
    lVar7 = std::__cxx11::string::size();
    std::ios_base::width((ios_base *)((long)&std::cout + lVar1),99 - lVar7);
    std::__cxx11::string::~string((string *)&local_228);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::left);
    poVar4 = std::operator<<(poVar4,"|");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
    hand::printHidden_abi_cxx11_(&local_248);
    poVar4 = std::operator<<(poVar4,(string *)&local_248);
    poVar4 = std::operator<<(poVar4," |");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_248);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"|");
  local_24c = (int)std::setw(100);
  poVar4 = std::operator<<(poVar4,(_Setw)local_24c);
  poVar4 = std::operator<<(poVar4,"hand |");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  lVar1 = *(long *)(std::cout + -0x18);
  sVar5 = std::stack<card,_std::deque<card,_std::allocator<card>_>_>::size(&this->deck);
  std::__cxx11::to_string(local_270,sVar5 >> 1);
  lVar7 = std::__cxx11::string::size();
  std::ios_base::width((ios_base *)((long)&std::cout + lVar1),0x61 - lVar7);
  std::__cxx11::string::~string((string *)local_270);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::left);
  poVar4 = std::operator<<(poVar4,"|");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
  poVar4 = std::operator<<(poVar4,"[");
  sVar5 = std::stack<card,_std::deque<card,_std::allocator<card>_>_>::size(&this->deck);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5 >> 1);
  poVar4 = std::operator<<(poVar4,"] |");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"|");
  _Var3 = std::setw(100);
  poVar4 = std::operator<<(poVar4,_Var3);
  poVar4 = std::operator<<(poVar4,"deck |");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"[");
  _Var3 = std::setw(0x32);
  poVar4 = std::operator<<(poVar4,_Var3);
  poVar4 = std::operator<<(poVar4,"player 1");
  _Var3 = std::setw(0x32);
  poVar4 = std::operator<<(poVar4,_Var3);
  poVar4 = std::operator<<(poVar4,"]");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void duel::printField() {
    cout << "[" << setw(50) << "player 2" << setw(50) << "]" << endl;
    cout << "| deck" << setw(95) << "|" << endl;
    cout << "| [" << deck.size()/2 << "]" << setw(97-to_string(deck.size()/2).size()) << "|" << endl;
    cout << "| hand" << setw(95) << "|" << endl;
    if(player == 2) cout << "| " << hand2.printHand() << setw(99-hand2.printHand().size()) << "|" << endl;
    else cout << "| " << hand2.printHidden() << setw(99-hand2.printHidden().size()) << "|" << endl;
    cout << "| pile" << setw(95) << "|" << endl;
    cout << "| " << field2.printPile() << setw(99-field2.printPile().size()) << "|" << endl;
    cout << "| score" << setw(94) << "|" << endl;
    cout << "| " << "{" << field2.getPile() << "}" << setw(97-to_string(field2.getPile()).size()) << "|" << endl;
    cout.width(97-to_string(field1.getPile()).size()); cout << left << "|" << right << "{" << field1.getPile() << "} |" << endl;
    cout << "|" << setw(100) << "score |" << endl;
    cout.width(99-field1.printPile().size()); cout << left << "|" << right << field1.printPile() << " |" << endl;
    cout << "|" << setw(100) << "pile |" << endl;
    if(player == 1) {
        cout.width(99-hand1.printHand().size()); cout << left << "|" << right << hand1.printHand() << " |" << endl;
    }
    else {
        cout.width(99-hand1.printHidden().size()); cout << left << "|" << right << hand1.printHidden() << " |" << endl;
    }
    cout << "|" << setw(100) << "hand |" << endl;
    cout.width(97-to_string(deck.size()/2).size()); cout << left << "|" << right << "[" << deck.size()/2 << "] |" << endl;
    cout << "|" << setw(100) << "deck |" << endl;
    cout << "[" << setw(50) << "player 1" << setw(50) << "]" << endl;
}